

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O0

double TasGrid::Optimizer::getNextNode<(TasGrid::TypeOneDRule)6>
                 (vector<double,_std::allocator<double>_> *nodes)

{
  double dVar1;
  CurrentNodes<(TasGrid::TypeOneDRule)6> local_38;
  OptimizerResult local_20;
  vector<double,_std::allocator<double>_> *local_10;
  vector<double,_std::allocator<double>_> *nodes_local;
  
  local_10 = nodes;
  CurrentNodes<(TasGrid::TypeOneDRule)6>::CurrentNodes(&local_38,nodes);
  local_20 = computeMaximum<(TasGrid::TypeOneDRule)6>(&local_38);
  dVar1 = local_20.node;
  CurrentNodes<(TasGrid::TypeOneDRule)6>::~CurrentNodes(&local_38);
  return dVar1;
}

Assistant:

double getNextNode(std::vector<double> const &nodes){
    return computeMaximum(CurrentNodes<rule>(nodes)).node;
}